

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::addHeaderField(DataDictionary *this,int field,bool required)

{
  mapped_type *pmVar1;
  int local_14;
  bool required_local;
  DataDictionary *pDStack_10;
  int field_local;
  DataDictionary *this_local;
  
  local_14 = field;
  pDStack_10 = this;
  if ((this->m_storeMsgFieldsOrder & 1U) != 0) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_headerOrderedFields,&local_14);
  }
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->m_headerFields,&local_14);
  *pmVar1 = required;
  return;
}

Assistant:

void addHeaderField( int field, bool required )
  {
    if (m_storeMsgFieldsOrder)
    {
      m_headerOrderedFields.push_back(field);
    }

    m_headerFields[ field ] = required;
  }